

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O1

void __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Realloc
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,uint64_t matrix_width,
          uint64_t matrix_height,uint8_t num_codes)

{
  AlignmentSubtype AVar1;
  Implementation *pIVar2;
  ulong in_RAX;
  long lVar3;
  undefined8 uStack_28;
  
  pIVar2 = (this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           .
           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
           ._M_head_impl;
  uStack_28 = in_RAX;
  if ((ulong)((long)*(pointer *)
                     ((long)&(pIVar2->node_id_to_rank).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     + 8) -
              *(long *)&(pIVar2->node_id_to_rank).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl >> 2
             ) < matrix_height - 1) {
    uStack_28 = in_RAX & 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&pIVar2->node_id_to_rank,matrix_height - 1,
               (value_type_conflict1 *)((long)&uStack_28 + 4));
  }
  pIVar2 = (this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           .
           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
           ._M_head_impl;
  if ((ulong)((long)*(pointer *)
                     ((long)&(pIVar2->sequence_profile_storage).
                             super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_> + 8)
              - *(long *)&(pIVar2->sequence_profile_storage).
                          super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl
             >> 5) < num_codes * matrix_width) {
    std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize
              (&pIVar2->sequence_profile_storage,num_codes * matrix_width);
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    pIVar2->sequence_profile =
         *(__mxxxi **)
          &(pIVar2->sequence_profile_storage).
           super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl;
  }
  AVar1 = (this->super_AlignmentEngine).subtype_;
  if (AVar1 == kConvex) {
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pIVar2->first_column).super__Vector_base<int,_std::allocator<int>_>
                       + 8) -
                *(long *)&(pIVar2->first_column).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl >> 2) < matrix_height * 3) {
      uStack_28 = uStack_28 & 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                (&pIVar2->first_column,matrix_height * 3,
                 (value_type_conflict3 *)((long)&uStack_28 + 4));
    }
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    lVar3 = matrix_height * matrix_width;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pIVar2->M_storage).
                               super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_> + 8
                       ) -
                *(long *)&(pIVar2->M_storage).
                          super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl
               >> 5) < (ulong)(lVar3 * 5)) {
      std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize
                (&pIVar2->M_storage,lVar3 * 5);
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pIVar2->H = *(__mxxxi **)
                   &(pIVar2->M_storage).
                    super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pIVar2->F = pIVar2->H + lVar3;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pIVar2->E = pIVar2->F + lVar3;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pIVar2->O = pIVar2->E + lVar3;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pIVar2->Q = pIVar2->O + lVar3;
    }
  }
  else if (AVar1 == kAffine) {
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pIVar2->first_column).super__Vector_base<int,_std::allocator<int>_>
                       + 8) -
                *(long *)&(pIVar2->first_column).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl >> 2) < matrix_height * 2) {
      uStack_28 = uStack_28 & 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                (&pIVar2->first_column,matrix_height * 2,
                 (value_type_conflict3 *)((long)&uStack_28 + 4));
    }
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    lVar3 = matrix_height * matrix_width;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pIVar2->M_storage).
                               super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_> + 8
                       ) -
                *(long *)&(pIVar2->M_storage).
                          super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl
               >> 5) < (ulong)(lVar3 * 3)) {
      std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize
                (&pIVar2->M_storage,lVar3 * 3);
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pIVar2->H = *(__mxxxi **)
                   &(pIVar2->M_storage).
                    super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pIVar2->F = pIVar2->H + lVar3;
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pIVar2->E = pIVar2->F + lVar3;
    }
  }
  else if (AVar1 == kLinear) {
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pIVar2->first_column).super__Vector_base<int,_std::allocator<int>_>
                       + 8) -
                *(long *)&(pIVar2->first_column).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl >> 2) < matrix_height) {
      uStack_28 = uStack_28 & 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                (&pIVar2->first_column,matrix_height,(value_type_conflict3 *)((long)&uStack_28 + 4))
      ;
    }
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pIVar2->M_storage).
                               super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_> + 8
                       ) -
                *(long *)&(pIVar2->M_storage).
                          super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl
               >> 5) < matrix_height * matrix_width) {
      std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize
                (&pIVar2->M_storage,matrix_height * matrix_width);
      pIVar2 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pIVar2->H = *(__mxxxi **)
                   &(pIVar2->M_storage).
                    super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl;
    }
  }
  pIVar2 = (this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           .
           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
           ._M_head_impl;
  if ((ulong)((long)*(pointer *)
                     ((long)&(pIVar2->masks_storage).
                             super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_> + 8)
             - *(long *)&(pIVar2->masks_storage).
                         super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl)
      < 0x81) {
    std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize(&pIVar2->masks_storage,5);
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    pIVar2->masks =
         *(__mxxxi **)
          &(pIVar2->masks_storage).super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>
           ._M_impl;
  }
  pIVar2 = (this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           .
           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
           ._M_head_impl;
  if ((ulong)((long)*(pointer *)
                     ((long)&(pIVar2->penalties_storage).
                             super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_> + 8)
             - *(long *)&(pIVar2->penalties_storage).
                         super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl)
      < 0x100) {
    std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize(&pIVar2->penalties_storage,8)
    ;
    pIVar2 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    pIVar2->penalties =
         *(__mxxxi **)
          &(pIVar2->penalties_storage).
           super__Vector_base<spoa::Storage,_std::allocator<spoa::Storage>_>._M_impl;
  }
  return;
}

Assistant:

void SimdAlignmentEngine<A>::Realloc(
    std::uint64_t matrix_width,
    std::uint64_t matrix_height,
    std::uint8_t num_codes) {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  if (pimpl_->node_id_to_rank.size() < matrix_height - 1) {
    pimpl_->node_id_to_rank.resize(matrix_height - 1, 0);
  }
  if (pimpl_->sequence_profile_storage.size() < num_codes * matrix_width) {
    pimpl_->sequence_profile_storage.resize(num_codes * matrix_width);
    pimpl_->sequence_profile = reinterpret_cast<__mxxxi*>(pimpl_->sequence_profile_storage.data());
  }
  if (subtype_ == AlignmentSubtype::kLinear) {
    if (pimpl_->first_column.size() < matrix_height) {
      pimpl_->first_column.resize(matrix_height, 0);
    }
    if (pimpl_->M_storage.size() < matrix_height * matrix_width) {
      pimpl_->M_storage.resize(matrix_height * matrix_width);
      pimpl_->H = reinterpret_cast<__mxxxi*>(pimpl_->M_storage.data());
    }
  } else if (subtype_ == AlignmentSubtype::kAffine) {
    if (pimpl_->first_column.size() < 2 * matrix_height) {
      pimpl_->first_column.resize(2 * matrix_height, 0);
    }
    if (pimpl_->M_storage.size() < 3 * matrix_height * matrix_width) {
      pimpl_->M_storage.resize(3 * matrix_height * matrix_width);
      pimpl_->H = reinterpret_cast<__mxxxi*>(pimpl_->M_storage.data());
      pimpl_->F = pimpl_->H + matrix_height * matrix_width;
      pimpl_->E = pimpl_->F + matrix_height * matrix_width;
    }
  } else if (subtype_ == AlignmentSubtype::kConvex) {
    if (pimpl_->first_column.size() < 3 * matrix_height) {
      pimpl_->first_column.resize(3 * matrix_height, 0);
    }
    if (pimpl_->M_storage.size() < 5 * matrix_height * matrix_width) {
      pimpl_->M_storage.resize(5 * matrix_height * matrix_width);
      pimpl_->H = reinterpret_cast<__mxxxi*>(pimpl_->M_storage.data());
      pimpl_->F = pimpl_->H + matrix_height * matrix_width;
      pimpl_->E = pimpl_->F + matrix_height * matrix_width;
      pimpl_->O = pimpl_->E + matrix_height * matrix_width;
      pimpl_->Q = pimpl_->O + matrix_height * matrix_width;
    }
  }
  if (pimpl_->masks_storage.size() < InstructionSet<A, std::int16_t>::kLogNumVar + 1) {
    pimpl_->masks_storage.resize(InstructionSet<A, std::int16_t>::kLogNumVar + 1);
    pimpl_->masks = reinterpret_cast<__mxxxi*>(pimpl_->masks_storage.data());
  }
  if (pimpl_->penalties_storage.size() < 2 * InstructionSet<A, std::int16_t>::kLogNumVar) {  // NOLINT
    pimpl_->penalties_storage.resize(2 * InstructionSet<A, std::int16_t>::kLogNumVar);
    pimpl_->penalties = reinterpret_cast<__mxxxi*>(pimpl_->penalties_storage.data());
  }
#endif
  (void) matrix_width;
  (void) matrix_height;
  (void) num_codes;
}